

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrasalrule.h
# Opt level: O0

int __thiscall jhu::thrax::PhrasalRule::numTokens<false>(PhrasalRule *this)

{
  int iVar1;
  const_iterator pvVar2;
  const_iterator pvVar3;
  Span local_14;
  PhrasalRule *local_10;
  PhrasalRule *this_local;
  
  local_10 = this;
  pvVar2 = std::array<jhu::thrax::NT,_4UL>::begin(&this->nts);
  pvVar3 = std::array<jhu::thrax::NT,_4UL>::end(&this->nts);
  local_14 = SpanPair::get<false>(&(this->lhs).span);
  iVar1 = Span::size(&local_14);
  iVar1 = std::
          accumulate<jhu::thrax::NT_const*,int,jhu::thrax::PhrasalRule::numTokens<false>()const::_lambda(int,auto:1_const&)_1_>
                    (pvVar2,pvVar3,iVar1);
  return iVar1;
}

Assistant:

int numTokens() const {
    return std::accumulate(
        nts.begin(),
        nts.end(),
        lhs.span.get<SourceSide>().size(),
        [](int total, const auto& nt) {
          auto sz = nt.span.template get<SourceSide>().size();
          return total - (sz == 0 ? 0 : sz - 1);
        });
  }